

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O3

string * __thiscall
OpenMPVariantClause::toString_abi_cxx11_(string *__return_storage_ptr__,OpenMPVariantClause *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  OpenMPDirective *pOVar2;
  int iVar3;
  long *plVar4;
  char *pcVar5;
  size_type *psVar6;
  undefined8 uVar7;
  _Alloc_hider _Var8;
  pointer __rhs_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string clause_string;
  string parameter_string;
  string beginning_symbol;
  string ending_symbol;
  string local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  undefined1 *local_1c8;
  char *local_1c0;
  undefined1 local_1b8;
  undefined7 uStack_1b7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  OpenMPVariantClause *local_188;
  string *local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  OpenMPClauseKind local_154;
  undefined1 *local_150;
  char *local_148;
  undefined1 local_140;
  undefined7 uStack_13f;
  undefined1 *local_130;
  char *local_128;
  undefined1 local_120;
  undefined7 uStack_11f;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_1f0 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1f0;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_1c8 = &local_1b8;
  local_1c0 = (char *)0x0;
  local_1b8 = 0;
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  local_178._M_string_length = 0;
  local_178.field_2._M_local_buf[0] = '\0';
  local_150 = &local_140;
  local_148 = (char *)0x0;
  local_140 = 0;
  local_130 = &local_120;
  local_128 = (char *)0x0;
  local_120 = 0;
  local_154 = (this->super_OpenMPClause).kind;
  if (local_154 == OMPC_when) {
    pcVar5 = "when";
LAB_0017c056:
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar5);
  }
  else {
    if (local_154 == OMPC_match) {
      pcVar5 = "match";
      goto LAB_0017c056;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"The variant clause is not supported.\n",0x25);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  iVar3 = std::__cxx11::string::compare((char *)&this->user_condition_expression);
  if (iVar3 == 0) {
    __rhs = &(this->user_condition_expression).second;
    iVar3 = std::__cxx11::string::compare((char *)__rhs);
    if (iVar3 != 0) {
      std::operator+(&local_1e8,"user = {condition(",__rhs);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_1e8);
      psVar6 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_210.field_2._M_allocated_capacity = *psVar6;
        local_210.field_2._8_8_ = plVar4[3];
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      }
      else {
        local_210.field_2._M_allocated_capacity = *psVar6;
        local_210._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_210._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_210);
      psVar6 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_230.field_2._M_allocated_capacity = *psVar6;
        local_230.field_2._8_8_ = plVar4[3];
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      }
      else {
        local_230.field_2._M_allocated_capacity = *psVar6;
        local_230._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_230._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_230._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      local_50.field_2._M_allocated_capacity = local_1e8.field_2._M_allocated_capacity;
      local_50._M_dataplus._M_p = local_1e8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) goto LAB_0017c400;
    }
  }
  else {
    std::operator+(&local_50,"user = {condition(score(",&(this->user_condition_expression).first);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_1a8.field_2._M_allocated_capacity = *psVar6;
      local_1a8.field_2._8_8_ = plVar4[3];
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    }
    else {
      local_1a8.field_2._M_allocated_capacity = *psVar6;
      local_1a8._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_1a8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_1a8,
                                (ulong)(this->user_condition_expression).second._M_dataplus._M_p);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_1e8.field_2._M_allocated_capacity = *psVar6;
      local_1e8.field_2._8_8_ = plVar4[3];
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    }
    else {
      local_1e8.field_2._M_allocated_capacity = *psVar6;
      local_1e8._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_1e8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_1e8);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_210.field_2._M_allocated_capacity = *psVar6;
      local_210.field_2._8_8_ = plVar4[3];
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    }
    else {
      local_210.field_2._M_allocated_capacity = *psVar6;
      local_210._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_210._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_210);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_230.field_2._M_allocated_capacity = *psVar6;
      local_230.field_2._8_8_ = plVar4[3];
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    }
    else {
      local_230.field_2._M_allocated_capacity = *psVar6;
      local_230._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_230._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_230._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_0017c400:
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->construct_directives).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->construct_directives).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::__cxx11::string::append((char *)&local_1c8);
    __rhs_00 = (this->construct_directives).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_188 = this;
    local_180 = __return_storage_ptr__;
    if (__rhs_00 !=
        (this->construct_directives).
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      paVar1 = &local_230.field_2;
      do {
        iVar3 = std::__cxx11::string::compare((char *)__rhs_00);
        if (iVar3 == 0) {
          if ((__rhs_00->second->clauses)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
            pcVar5 = "";
            std::__cxx11::string::_M_replace((ulong)&local_150,0,local_148,0x1a66ad);
          }
          else {
            std::__cxx11::string::_M_replace((ulong)&local_150,0,local_148,0x1a7c5b);
            pcVar5 = ")";
          }
        }
        else {
          std::operator+(&local_210,"score(",&__rhs_00->first);
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_210);
          psVar6 = (size_type *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar6) {
            local_230.field_2._M_allocated_capacity = *psVar6;
            local_230.field_2._8_8_ = plVar4[3];
            local_230._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_230.field_2._M_allocated_capacity = *psVar6;
            local_230._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_230._M_string_length = plVar4[1];
          *plVar4 = (long)psVar6;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_150,(string *)&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != paVar1) {
            operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != &local_210.field_2) {
            operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
          }
          pcVar5 = ")";
        }
        std::__cxx11::string::_M_replace((ulong)&local_130,0,local_128,(ulong)pcVar5);
        pOVar2 = __rhs_00->second;
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"");
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,local_150,local_148 + (long)local_150);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f0,local_130,local_128 + (long)local_130);
        OpenMPDirective::generatePragmaString(&local_210,pOVar2,&local_110,&local_d0,&local_f0);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_210);
        psVar6 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_230.field_2._M_allocated_capacity = *psVar6;
          local_230.field_2._8_8_ = plVar4[3];
          local_230._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_230.field_2._M_allocated_capacity = *psVar6;
          local_230._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_230._M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_230._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != paVar1) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        __rhs_00 = __rhs_00 + 1;
      } while (__rhs_00 !=
               (local_188->construct_directives).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__cxx11::string::substr((ulong)&local_230,(ulong)&local_1c8);
    std::__cxx11::string::operator=((string *)&local_1c8,(string *)&local_230);
    __return_storage_ptr__ = local_180;
    this = local_188;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_1c8);
  }
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_1c8);
  local_178._M_string_length = 0;
  *local_178._M_dataplus._M_p = '\0';
  local_1c0 = (char *)0x0;
  *local_1c8 = 0;
  if ((this->arch_expression).first._M_string_length == 0) {
    if ((this->arch_expression).second._M_string_length != 0) {
      std::operator+(&local_210,"arch(",&(this->arch_expression).second);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_210);
      psVar6 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_230.field_2._M_allocated_capacity = *psVar6;
        local_230.field_2._8_8_ = plVar4[3];
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      }
      else {
        local_230.field_2._M_allocated_capacity = *psVar6;
        local_230._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_230._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_230._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      uVar7 = local_210.field_2._M_allocated_capacity;
      _Var8._M_p = local_210._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) goto LAB_0017ca73;
    }
  }
  else {
    std::operator+(&local_1a8,"arch(score(",&(this->arch_expression).first);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_1a8);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_1e8.field_2._M_allocated_capacity = *psVar6;
      local_1e8.field_2._8_8_ = plVar4[3];
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    }
    else {
      local_1e8.field_2._M_allocated_capacity = *psVar6;
      local_1e8._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_1e8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_1e8,
                                (ulong)(this->arch_expression).second._M_dataplus._M_p);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_210.field_2._M_allocated_capacity = *psVar6;
      local_210.field_2._8_8_ = plVar4[3];
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    }
    else {
      local_210.field_2._M_allocated_capacity = *psVar6;
      local_210._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_210._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_210);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_230.field_2._M_allocated_capacity = *psVar6;
      local_230.field_2._8_8_ = plVar4[3];
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    }
    else {
      local_230.field_2._M_allocated_capacity = *psVar6;
      local_230._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_230._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_230._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    uVar7 = local_1a8.field_2._M_allocated_capacity;
    _Var8._M_p = local_1a8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
LAB_0017ca73:
      operator_delete(_Var8._M_p,uVar7 + 1);
    }
  }
  if ((this->isa_expression).first._M_string_length == 0) {
    if ((this->isa_expression).second._M_string_length != 0) {
      std::operator+(&local_210,"isa(",&(this->isa_expression).second);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_210);
      psVar6 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_230.field_2._M_allocated_capacity = *psVar6;
        local_230.field_2._8_8_ = plVar4[3];
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      }
      else {
        local_230.field_2._M_allocated_capacity = *psVar6;
        local_230._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_230._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_230._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      uVar7 = local_210.field_2._M_allocated_capacity;
      _Var8._M_p = local_210._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) goto LAB_0017cce3;
    }
  }
  else {
    std::operator+(&local_1a8,"isa(score(",&(this->isa_expression).first);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_1a8);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_1e8.field_2._M_allocated_capacity = *psVar6;
      local_1e8.field_2._8_8_ = plVar4[3];
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    }
    else {
      local_1e8.field_2._M_allocated_capacity = *psVar6;
      local_1e8._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_1e8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_1e8,
                                (ulong)(this->isa_expression).second._M_dataplus._M_p);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_210.field_2._M_allocated_capacity = *psVar6;
      local_210.field_2._8_8_ = plVar4[3];
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    }
    else {
      local_210.field_2._M_allocated_capacity = *psVar6;
      local_210._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_210._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_210);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_230.field_2._M_allocated_capacity = *psVar6;
      local_230.field_2._8_8_ = plVar4[3];
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    }
    else {
      local_230.field_2._M_allocated_capacity = *psVar6;
      local_230._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_230._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_230._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    uVar7 = local_1a8.field_2._M_allocated_capacity;
    _Var8._M_p = local_1a8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
LAB_0017cce3:
      operator_delete(_Var8._M_p,uVar7 + 1);
    }
  }
  switch((this->context_kind_name).second) {
  case OMPC_CONTEXT_KIND_host:
    pcVar5 = "host";
    break;
  case OMPC_CONTEXT_KIND_nohost:
    pcVar5 = "nohost";
    break;
  case OMPC_CONTEXT_KIND_any:
    pcVar5 = "any";
    break;
  case OMPC_CONTEXT_KIND_cpu:
    pcVar5 = "cpu";
    break;
  case OMPC_CONTEXT_KIND_gpu:
    pcVar5 = "gpu";
    break;
  case OMPC_CONTEXT_KIND_fpga:
    pcVar5 = "fpga";
    break;
  case OMPC_CONTEXT_KIND_unknown:
    goto switchD_0017cd0c_caseD_6;
  default:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"The context kind is not supported.\n",0x23);
    goto switchD_0017cd0c_caseD_6;
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_178,0,(char *)local_178._M_string_length,(ulong)pcVar5);
switchD_0017cd0c_caseD_6:
  if ((this->context_kind_name).first._M_string_length == 0) {
    if ((char *)local_178._M_string_length != (char *)0x0) {
      std::operator+(&local_210,"kind(",&local_178);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_210);
      psVar6 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_230.field_2._M_allocated_capacity = *psVar6;
        local_230.field_2._8_8_ = plVar4[3];
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      }
      else {
        local_230.field_2._M_allocated_capacity = *psVar6;
        local_230._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_230._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_230._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      uVar7 = local_210.field_2._M_allocated_capacity;
      _Var8._M_p = local_210._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) goto LAB_0017cff3;
    }
  }
  else {
    std::operator+(&local_1a8,"kind(score(",&(this->context_kind_name).first);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_1a8);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_1e8.field_2._M_allocated_capacity = *psVar6;
      local_1e8.field_2._8_8_ = plVar4[3];
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    }
    else {
      local_1e8.field_2._M_allocated_capacity = *psVar6;
      local_1e8._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_1e8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_1e8,(ulong)local_178._M_dataplus._M_p);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_210.field_2._M_allocated_capacity = *psVar6;
      local_210.field_2._8_8_ = plVar4[3];
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    }
    else {
      local_210.field_2._M_allocated_capacity = *psVar6;
      local_210._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_210._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_210);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_230.field_2._M_allocated_capacity = *psVar6;
      local_230.field_2._8_8_ = plVar4[3];
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    }
    else {
      local_230.field_2._M_allocated_capacity = *psVar6;
      local_230._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_230._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_230._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    uVar7 = local_1a8.field_2._M_allocated_capacity;
    _Var8._M_p = local_1a8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
LAB_0017cff3:
      operator_delete(_Var8._M_p,uVar7 + 1);
    }
  }
  if (local_1c0 != (char *)0x0) {
    std::__cxx11::string::substr((ulong)&local_1e8,(ulong)&local_1c8);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_1e8,0,(char *)0x0,0x1a7ae8);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_210.field_2._M_allocated_capacity = *psVar6;
      local_210.field_2._8_8_ = plVar4[3];
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    }
    else {
      local_210.field_2._M_allocated_capacity = *psVar6;
      local_210._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_210._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_210);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_230.field_2._M_allocated_capacity = *psVar6;
      local_230.field_2._8_8_ = plVar4[3];
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    }
    else {
      local_230.field_2._M_allocated_capacity = *psVar6;
      local_230._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_230._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_230._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
  }
  local_1c0 = (char *)0x0;
  *local_1c8 = 0;
  local_178._M_string_length = 0;
  *local_178._M_dataplus._M_p = '\0';
  switch((this->context_vendor_name).second) {
  case OMPC_CONTEXT_VENDOR_amd:
    pcVar5 = "amd";
    break;
  case OMPC_CONTEXT_VENDOR_arm:
    pcVar5 = "arm";
    break;
  case OMPC_CONTEXT_VENDOR_bsc:
    pcVar5 = "bsc";
    break;
  case OMPC_CONTEXT_VENDOR_cray:
    pcVar5 = "cray";
    break;
  case OMPC_CONTEXT_VENDOR_fujitsu:
    pcVar5 = "fujitsu";
    break;
  case OMPC_CONTEXT_VENDOR_gnu:
    pcVar5 = "gnu";
    break;
  case OMPC_CONTEXT_VENDOR_ibm:
    pcVar5 = "ibm";
    break;
  case OMPC_CONTEXT_VENDOR_intel:
    pcVar5 = "intel";
    break;
  case OMPC_CONTEXT_VENDOR_llvm:
    pcVar5 = "llvm";
    break;
  case OMPC_CONTEXT_VENDOR_pgi:
    pcVar5 = "pgi";
    break;
  case OMPC_CONTEXT_VENDOR_ti:
    pcVar5 = "ti";
    break;
  default:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"The context vendor is not supported.\n",0x25);
    goto switchD_0017d170_caseD_d;
  case OMPC_CONTEXT_VENDOR_unknown:
    pcVar5 = "unknown";
    break;
  case OMPC_CONTEXT_VENDOR_unspecified:
    goto switchD_0017d170_caseD_d;
  }
  std::__cxx11::string::_M_replace((ulong)&local_178,0,(char *)0x0,(ulong)pcVar5);
switchD_0017d170_caseD_d:
  if ((this->context_vendor_name).first._M_string_length == 0) {
    if (local_178._M_string_length != 0) {
      std::operator+(&local_210,"vendor(",&local_178);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_210);
      psVar6 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_230.field_2._M_allocated_capacity = *psVar6;
        local_230.field_2._8_8_ = plVar4[3];
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      }
      else {
        local_230.field_2._M_allocated_capacity = *psVar6;
        local_230._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_230._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_230._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      uVar7 = local_210.field_2._M_allocated_capacity;
      _Var8._M_p = local_210._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) goto LAB_0017d4a2;
    }
  }
  else {
    std::operator+(&local_1a8,"vendor(score(",&(this->context_vendor_name).first);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_1a8);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_1e8.field_2._M_allocated_capacity = *psVar6;
      local_1e8.field_2._8_8_ = plVar4[3];
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    }
    else {
      local_1e8.field_2._M_allocated_capacity = *psVar6;
      local_1e8._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_1e8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_1e8,(ulong)local_178._M_dataplus._M_p);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_210.field_2._M_allocated_capacity = *psVar6;
      local_210.field_2._8_8_ = plVar4[3];
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    }
    else {
      local_210.field_2._M_allocated_capacity = *psVar6;
      local_210._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_210._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_210);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_230.field_2._M_allocated_capacity = *psVar6;
      local_230.field_2._8_8_ = plVar4[3];
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    }
    else {
      local_230.field_2._M_allocated_capacity = *psVar6;
      local_230._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_230._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_230._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    uVar7 = local_1a8.field_2._M_allocated_capacity;
    _Var8._M_p = local_1a8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
LAB_0017d4a2:
      operator_delete(_Var8._M_p,uVar7 + 1);
    }
  }
  if ((this->extension_expression).first._M_string_length == 0) {
    if ((this->extension_expression).second._M_string_length == 0) goto LAB_0017d71a;
    std::operator+(&local_210,"extension(",&(this->extension_expression).second);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_210);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_230.field_2._M_allocated_capacity = *psVar6;
      local_230.field_2._8_8_ = plVar4[3];
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    }
    else {
      local_230.field_2._M_allocated_capacity = *psVar6;
      local_230._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_230._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_230._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    uVar7 = local_210.field_2._M_allocated_capacity;
    _Var8._M_p = local_210._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p == &local_210.field_2) goto LAB_0017d71a;
  }
  else {
    std::operator+(&local_1a8,"extension(score(",&(this->extension_expression).first);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_1a8);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_1e8.field_2._M_allocated_capacity = *psVar6;
      local_1e8.field_2._8_8_ = plVar4[3];
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    }
    else {
      local_1e8.field_2._M_allocated_capacity = *psVar6;
      local_1e8._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_1e8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_1e8,
                                (ulong)(this->extension_expression).second._M_dataplus._M_p);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_210.field_2._M_allocated_capacity = *psVar6;
      local_210.field_2._8_8_ = plVar4[3];
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    }
    else {
      local_210.field_2._M_allocated_capacity = *psVar6;
      local_210._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_210._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_210);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_230.field_2._M_allocated_capacity = *psVar6;
      local_230.field_2._8_8_ = plVar4[3];
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    }
    else {
      local_230.field_2._M_allocated_capacity = *psVar6;
      local_230._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_230._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_230._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    uVar7 = local_1a8.field_2._M_allocated_capacity;
    _Var8._M_p = local_1a8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p == &local_1a8.field_2) goto LAB_0017d71a;
  }
  operator_delete(_Var8._M_p,uVar7 + 1);
LAB_0017d71a:
  if (local_1c0 != (char *)0x0) {
    std::__cxx11::string::substr((ulong)&local_1e8,(ulong)&local_1c8);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_1e8,0,(char *)0x0,0x1a7b86);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_210.field_2._M_allocated_capacity = *psVar6;
      local_210.field_2._8_8_ = plVar4[3];
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    }
    else {
      local_210.field_2._M_allocated_capacity = *psVar6;
      local_210._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_210._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_210);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_230.field_2._M_allocated_capacity = *psVar6;
      local_230.field_2._8_8_ = plVar4[3];
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    }
    else {
      local_230.field_2._M_allocated_capacity = *psVar6;
      local_230._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_230._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_230._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
  }
  local_1c0 = (char *)0x0;
  *local_1c8 = 0;
  std::__cxx11::string::substr((ulong)&local_230,(ulong)__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_230);
  paVar1 = &local_230.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != paVar1) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if (local_154 == OMPC_when) {
    std::__cxx11::string::_M_replace((ulong)&local_1c8,0,local_1c0,0x1a73b6);
    pOVar2 = (OpenMPDirective *)this[1].super_OpenMPClause._vptr_OpenMPClause;
    if (pOVar2 != (OpenMPDirective *)0x0) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
      OpenMPDirective::generatePragmaString(&local_230,pOVar2,&local_70,&local_90,&local_b0);
      std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_230._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != paVar1) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
  }
  local_230._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_230,local_1c8,local_1c0 + (long)local_1c8);
  std::__cxx11::string::append((char *)&local_230);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_230._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != paVar1) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,CONCAT71(uStack_11f,local_120) + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,CONCAT71(uStack_13f,local_140) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,
                    CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                             local_178.field_2._M_local_buf[0]) + 1);
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,CONCAT71(uStack_1b7,local_1b8) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPVariantClause::toString() {

    std::string result;
    std::string clause_string;
    std::string parameter_string;
    std::string beginning_symbol;
    std::string ending_symbol;
    std::pair<std::string, std::string>* parameter_pair_string = NULL;
    OpenMPDirective* variant_directive = NULL;
    OpenMPClauseKind clause_kind = this->getKind();
    switch (clause_kind) {
        case OMPC_when:
            result = "when";
            break;
        case OMPC_match:
            result = "match";
            break;
        default:
            std::cout << "The variant clause is not supported.\n";
    };
    result += " (";

    // check user
    parameter_pair_string = this->getUserCondition();
    if (parameter_pair_string->first != "") {
        clause_string += "user = {condition(score(" + parameter_pair_string->first + "): " + parameter_pair_string->second + ")}" + ", ";
    }
    else if (parameter_pair_string->second != "") {
        clause_string += "user = {condition(" + parameter_pair_string->second + ")}" + ", ";
    };

    // check construct
    std::vector<std::pair<std::string, OpenMPDirective*> >* parameter_pair_directives = this->getConstructDirective();
    if (parameter_pair_directives->size() != 0) {
        clause_string += "construct = {";
        std::vector<std::pair<std::string, OpenMPDirective*> >::iterator iter;
        for (iter = parameter_pair_directives->begin(); iter != parameter_pair_directives->end(); iter++) {
            if ((*iter).first != "") {
                beginning_symbol = "score(" + (*iter).first + "): ";
                ending_symbol = ")";
            }
            else if ((*iter).second->getAllClauses()->size() != 0){
                beginning_symbol = "(";
                ending_symbol = ")";
            }
            else {
                beginning_symbol = "";
                ending_symbol = "";
            };
            clause_string += (*iter).second->generatePragmaString("", beginning_symbol, ending_symbol) + ", ";
        };
        clause_string = clause_string.substr(0, clause_string.size()-2);
        clause_string += "}, ";
    }

    result += clause_string;
    parameter_string.clear();

    // check device
    clause_string.clear();
    // check device arch
    parameter_pair_string = this->getArchExpression();
    if (parameter_pair_string->first.size() > 0) {
        clause_string += "arch(score(" + parameter_pair_string->first + "): " + parameter_pair_string->second + "), ";
    }
    else if (parameter_pair_string->second.size() > 0) {
        clause_string += "arch(" + parameter_pair_string->second + "), ";
    };

    // check device isa
    parameter_pair_string = this->getIsaExpression();
    if (parameter_pair_string->first.size() > 0) {
        clause_string += "isa(score(" + parameter_pair_string->first + "): " + parameter_pair_string->second + "), ";
    }
    else if (parameter_pair_string->second.size() > 0) {
        clause_string += "isa(" + parameter_pair_string->second + "), ";
    };

    // check device_kind
    std::pair<std::string, OpenMPClauseContextKind>* context_kind = this->getContextKind();
    switch (context_kind->second) {
        case OMPC_CONTEXT_KIND_host:
            parameter_string = "host";
            break;
        case OMPC_CONTEXT_KIND_nohost:
            parameter_string = "nohost";
            break;
        case OMPC_CONTEXT_KIND_any:
            parameter_string = "any";
            break;
        case OMPC_CONTEXT_KIND_cpu:
            parameter_string = "cpu";
            break;
        case OMPC_CONTEXT_KIND_gpu:
            parameter_string = "gpu";
            break;
        case OMPC_CONTEXT_KIND_fpga:
            parameter_string = "fpga";
            break;
        case OMPC_CONTEXT_KIND_unknown:
            break;
        default:
            std::cout << "The context kind is not supported.\n";
    };

    if (context_kind->first.size() > 0) {
        clause_string += "kind(score(" + context_kind->first + "): " + parameter_string + "), ";
    }
    else if (parameter_string.size() > 0) {
        clause_string += "kind(" + parameter_string + "), ";
    };

    if (clause_string.size() > 0) {
        result += "device = {" + clause_string.substr(0, clause_string.size()-2) + "}, ";
    };

    // check implementation
    clause_string.clear();
    parameter_string.clear();
    // check implementation vendor
    std::pair<std::string, OpenMPClauseContextVendor>* context_vendor = this->getImplementationKind();
    switch (context_vendor->second) {
        case OMPC_CONTEXT_VENDOR_amd:
            parameter_string = "amd";
            break;
        case OMPC_CONTEXT_VENDOR_arm:
            parameter_string = "arm";
            break;
        case OMPC_CONTEXT_VENDOR_bsc:
            parameter_string = "bsc";
            break;
        case OMPC_CONTEXT_VENDOR_cray:
            parameter_string = "cray";
            break;
        case OMPC_CONTEXT_VENDOR_fujitsu:
            parameter_string = "fujitsu";
            break;
        case OMPC_CONTEXT_VENDOR_gnu:
            parameter_string = "gnu";
            break;
        case OMPC_CONTEXT_VENDOR_ibm:
            parameter_string = "ibm";
            break;
        case OMPC_CONTEXT_VENDOR_intel:
            parameter_string = "intel";
            break;
        case OMPC_CONTEXT_VENDOR_llvm:
            parameter_string = "llvm";
            break;
        case OMPC_CONTEXT_VENDOR_pgi:
            parameter_string = "pgi";
            break;
        case OMPC_CONTEXT_VENDOR_ti:
            parameter_string = "ti";
            break;
        case OMPC_CONTEXT_VENDOR_unknown:
            parameter_string = "unknown";
            break;
        case OMPC_CONTEXT_VENDOR_unspecified:
            break;
        default:
            std::cout << "The context vendor is not supported.\n";
    };
    if (context_vendor->first.size() > 0) {
        clause_string += "vendor(score(" + context_vendor->first + "): " + parameter_string + "), ";
    }
    else if (parameter_string.size() > 0) {
        clause_string += "vendor(" + parameter_string + "), ";
    };

    // check implementation extension
    parameter_pair_string = this->getExtensionExpression();
    if (parameter_pair_string->first.size() > 0) {
        clause_string += "extension(score(" + parameter_pair_string->first + "): " + parameter_pair_string->second + "), ";
    }
    else if (parameter_pair_string->second.size() > 0) {
        clause_string += "extension(" + parameter_pair_string->second + "), ";
    };

    if (clause_string.size() > 0) {
        result += "implementation = {" + clause_string.substr(0, clause_string.size()-2) + "}, ";
    };

    clause_string.clear();
    result = result.substr(0, result.size()-2);

    if (clause_kind == OMPC_when) {
        clause_string = " : ";
        variant_directive = ((OpenMPWhenClause*)this)->getVariantDirective();
        if (variant_directive != NULL) {
            clause_string += variant_directive->generatePragmaString("");
        };
    };

    result += clause_string + ") ";

    return result;
}